

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlDumpXMLCatalogNode
               (xmlCatalogEntryPtr catal,xmlNodePtr catalog,xmlDocPtr doc,xmlNsPtr ns,
               xmlCatalogEntryPtr cgroup)

{
  xmlNodePtr node;
  xmlNsPtr ns_00;
  xmlChar *pxVar1;
  char *pcVar2;
  _xmlCatalogEntry *cgroup_00;
  
  cgroup_00 = catal;
  do {
    if (cgroup_00 == (xmlCatalogEntryPtr)0x0) {
      return;
    }
    if (cgroup_00->group != cgroup) goto switchD_0013d1aa_default;
    switch(cgroup_00->type) {
    case XML_CATA_CATALOG:
    case XML_CATA_BROKEN_CATALOG:
      cgroup_00 = (_xmlCatalogEntry *)(&cgroup_00->next + (ulong)(cgroup_00 == catal) * 2);
      goto switchD_0013d1aa_default;
    case XML_CATA_NEXT_CATALOG:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"nextCatalog",(xmlChar *)0x0);
      pxVar1 = cgroup_00->value;
      goto LAB_0013d424;
    case XML_CATA_GROUP:
      node = xmlNewDocNode(doc,ns,"group",(xmlChar *)0x0);
      xmlSetProp(node,"id",cgroup_00->name);
      if ((cgroup_00->value != (xmlChar *)0x0) &&
         (ns_00 = xmlSearchNsByHref(doc,node,(xmlChar *)"http://www.w3.org/XML/1998/namespace"),
         ns_00 != (xmlNsPtr)0x0)) {
        xmlSetNsProp(node,ns_00,"base",cgroup_00->value);
      }
      pcVar2 = "public";
      if (cgroup_00->prefer == XML_CATA_PREFER_PUBLIC) {
LAB_0013d309:
        xmlSetProp(node,(xmlChar *)"prefer",(xmlChar *)pcVar2);
      }
      else if (cgroup_00->prefer == XML_CATA_PREFER_SYSTEM) {
        pcVar2 = "system";
        goto LAB_0013d309;
      }
      xmlDumpXMLCatalogNode(cgroup_00->next,node,doc,ns,cgroup_00);
      goto LAB_0013d430;
    case XML_CATA_PUBLIC:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"public",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "publicId";
      goto LAB_0013d37a;
    case XML_CATA_SYSTEM:
      node = xmlNewDocNode(doc,ns,"system",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "systemId";
LAB_0013d37a:
      xmlSetProp(node,(xmlChar *)pcVar2,pxVar1);
      pxVar1 = cgroup_00->value;
      pcVar2 = "uri";
      goto LAB_0013d42b;
    case XML_CATA_REWRITE_SYSTEM:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"rewriteSystem",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "systemIdStartString";
      goto LAB_0013d3de;
    case XML_CATA_DELEGATE_PUBLIC:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"delegatePublic",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "publicIdStartString";
      break;
    case XML_CATA_DELEGATE_SYSTEM:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"delegateSystem",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "systemIdStartString";
      break;
    case XML_CATA_URI:
      node = xmlNewDocNode(doc,ns,"uri",(xmlChar *)0x0);
      xmlSetProp(node,"name",cgroup_00->name);
      pxVar1 = cgroup_00->value;
      pcVar2 = "uri";
      goto LAB_0013d42b;
    case XML_CATA_REWRITE_URI:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"rewriteURI",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "uriStartString";
LAB_0013d3de:
      xmlSetProp(node,(xmlChar *)pcVar2,pxVar1);
      pxVar1 = cgroup_00->value;
      pcVar2 = "rewritePrefix";
      goto LAB_0013d42b;
    case XML_CATA_DELEGATE_URI:
      node = xmlNewDocNode(doc,ns,(xmlChar *)"delegateURI",(xmlChar *)0x0);
      pxVar1 = cgroup_00->name;
      pcVar2 = "uriStartString";
      break;
    default:
      goto switchD_0013d1aa_default;
    }
    xmlSetProp(node,(xmlChar *)pcVar2,pxVar1);
    pxVar1 = cgroup_00->value;
LAB_0013d424:
    pcVar2 = "catalog";
LAB_0013d42b:
    xmlSetProp(node,(xmlChar *)pcVar2,pxVar1);
LAB_0013d430:
    xmlAddChild(catalog,node);
switchD_0013d1aa_default:
    cgroup_00 = cgroup_00->next;
  } while( true );
}

Assistant:

static void xmlDumpXMLCatalogNode(xmlCatalogEntryPtr catal, xmlNodePtr catalog,
		    xmlDocPtr doc, xmlNsPtr ns, xmlCatalogEntryPtr cgroup) {
    xmlNodePtr node;
    xmlCatalogEntryPtr cur;
    /*
     * add all the catalog entries
     */
    cur = catal;
    while (cur != NULL) {
        if (cur->group == cgroup) {
	    switch (cur->type) {
	        case XML_CATA_REMOVED:
		    break;
	        case XML_CATA_BROKEN_CATALOG:
	        case XML_CATA_CATALOG:
		    if (cur == catal) {
			cur = cur->children;
		        continue;
		    }
		    break;
		case XML_CATA_NEXT_CATALOG:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "nextCatalog", NULL);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
                    break;
		case XML_CATA_NONE:
		    break;
		case XML_CATA_GROUP:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "group", NULL);
		    xmlSetProp(node, BAD_CAST "id", cur->name);
		    if (cur->value != NULL) {
		        xmlNsPtr xns;
			xns = xmlSearchNsByHref(doc, node, XML_XML_NAMESPACE);
			if (xns != NULL)
			    xmlSetNsProp(node, xns, BAD_CAST "base",
					 cur->value);
		    }
		    switch (cur->prefer) {
			case XML_CATA_PREFER_NONE:
		            break;
			case XML_CATA_PREFER_PUBLIC:
		            xmlSetProp(node, BAD_CAST "prefer", BAD_CAST "public");
			    break;
			case XML_CATA_PREFER_SYSTEM:
		            xmlSetProp(node, BAD_CAST "prefer", BAD_CAST "system");
			    break;
		    }
		    xmlDumpXMLCatalogNode(cur->next, node, doc, ns, cur);
		    xmlAddChild(catalog, node);
	            break;
		case XML_CATA_PUBLIC:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "public", NULL);
		    xmlSetProp(node, BAD_CAST "publicId", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "system", NULL);
		    xmlSetProp(node, BAD_CAST "systemId", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_REWRITE_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "rewriteSystem", NULL);
		    xmlSetProp(node, BAD_CAST "systemIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "rewritePrefix", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_PUBLIC:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegatePublic", NULL);
		    xmlSetProp(node, BAD_CAST "publicIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_SYSTEM:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegateSystem", NULL);
		    xmlSetProp(node, BAD_CAST "systemIdStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "uri", NULL);
		    xmlSetProp(node, BAD_CAST "name", cur->name);
		    xmlSetProp(node, BAD_CAST "uri", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_REWRITE_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "rewriteURI", NULL);
		    xmlSetProp(node, BAD_CAST "uriStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "rewritePrefix", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case XML_CATA_DELEGATE_URI:
		    node = xmlNewDocNode(doc, ns, BAD_CAST "delegateURI", NULL);
		    xmlSetProp(node, BAD_CAST "uriStartString", cur->name);
		    xmlSetProp(node, BAD_CAST "catalog", cur->value);
		    xmlAddChild(catalog, node);
		    break;
		case SGML_CATA_SYSTEM:
		case SGML_CATA_PUBLIC:
		case SGML_CATA_ENTITY:
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		case SGML_CATA_DELEGATE:
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    break;
	    }
        }
	cur = cur->next;
    }
}